

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cc
# Opt level: O3

int __thiscall kratos::Context::remove(Context *this,char *__filename)

{
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>,_true>
  _Var1;
  iterator iVar2;
  __node_type *extraout_RAX;
  __node_type *extraout_RAX_00;
  __node_type *p_Var3;
  bool bVar4;
  pair<std::_Rb_tree_iterator<std::shared_ptr<kratos::Generator>_>,_std::_Rb_tree_iterator<std::shared_ptr<kratos::Generator>_>_>
  pVar5;
  key_type local_30;
  
  _Var1._M_cur = (__node_type *)
                 std::
                 _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         *)this,(key_type *)(__filename + 0x78));
  if (_Var1._M_cur != (__node_type *)0x0) {
    iVar2 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)this,(key_type *)(__filename + 0x78));
    if (iVar2.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>,_true>
        ._M_cur == (__node_type *)0x0) {
      std::__throw_out_of_range("_Map_base::at");
    }
    std::__shared_ptr<kratos::Generator,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<kratos::Generator,void>
              ((__shared_ptr<kratos::Generator,(__gnu_cxx::_Lock_policy)2> *)&local_30,
               (__weak_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2> *)(__filename + 0x68));
    _Var1._M_cur = *(__node_type **)
                    ((long)iVar2.
                           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>,_true>
                           ._M_cur + 0x38);
    if (_Var1._M_cur != (__node_type *)0x0) {
      p_Var3 = (__node_type *)
               ((long)iVar2.
                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>,_true>
                      ._M_cur + 0x30);
      do {
        bVar4 = *(element_type **)
                 ((long)&((_Var1._M_cur)->
                         super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>,_true>
                         ).
                         super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>_>
                         ._M_storage._M_storage + 0x18) <
                local_30.super___shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (!bVar4) {
          p_Var3 = _Var1._M_cur;
        }
        _Var1._M_cur = *(__node_type **)
                        ((long)&((_Var1._M_cur)->
                                super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>,_true>
                                ).
                                super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>_>
                                ._M_storage._M_storage + (ulong)bVar4 * 8 + 8);
      } while (_Var1._M_cur != (__node_type *)0x0);
      _Var1._M_cur = (__node_type *)0x0;
      if ((p_Var3 != (__node_type *)
                     ((long)iVar2.
                            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>,_true>
                            ._M_cur + 0x30)) &&
         (*(element_type **)
           ((long)&(p_Var3->
                   super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>,_true>
                   ).
                   super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>_>
                   ._M_storage._M_storage + 0x18) <=
          local_30.super___shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>._M_ptr)) {
        pVar5 = std::
                _Rb_tree<std::shared_ptr<kratos::Generator>,_std::shared_ptr<kratos::Generator>,_std::_Identity<std::shared_ptr<kratos::Generator>_>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
                ::equal_range((_Rb_tree<std::shared_ptr<kratos::Generator>,_std::shared_ptr<kratos::Generator>,_std::_Identity<std::shared_ptr<kratos::Generator>_>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
                               *)((long)iVar2.
                                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>,_true>
                                        ._M_cur + 0x28),&local_30);
        std::
        _Rb_tree<std::shared_ptr<kratos::Generator>,_std::shared_ptr<kratos::Generator>,_std::_Identity<std::shared_ptr<kratos::Generator>_>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
        ::_M_erase_aux((_Rb_tree<std::shared_ptr<kratos::Generator>,_std::shared_ptr<kratos::Generator>,_std::_Identity<std::shared_ptr<kratos::Generator>_>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
                        *)((long)iVar2.
                                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>,_true>
                                 ._M_cur + 0x28),(_Base_ptr)pVar5.first._M_node,
                       (_Base_ptr)pVar5.second._M_node);
        _Var1._M_cur = extraout_RAX;
      }
    }
    if (local_30.super___shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_30.super___shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      _Var1._M_cur = extraout_RAX_00;
    }
  }
  return (int)_Var1._M_cur;
}

Assistant:

void Context::remove(Generator *generator) {
    if (modules_.find(generator->name) == modules_.end()) return;
    auto &module_set = modules_.at(generator->name);
    // TODO:
    //  Write a complete pass to remove the generator
    //  1. remove any connections/assignments
    //  2. remove itself from the parent
    auto const &shared_ptr = generator->shared_from_this();
    if (module_set.find(shared_ptr) != module_set.end()) module_set.erase(shared_ptr);
}